

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O0

void __thiscall String::reserve(String *this,usize size)

{
  usize local_30;
  usize size_local;
  String *this_local;
  
  local_30 = size;
  if (size < this->data->len) {
    local_30 = this->data->len;
  }
  detach(this,this->data->len,local_30);
  return;
}

Assistant:

String& prepend(const String& str)
  {
    String copy(*this);
    usize newLen = str.data->len + copy.data->len;
    detach(0, newLen);
    Memory::copy((char*)data->str, str.data->str, str.data->len * sizeof(char));
    Memory::copy((char*)data->str + str.data->len, copy.data->str, copy.data->len * sizeof(char));
    ((char*)data->str)[data->len = newLen] = '\0';
    return *this;
  }